

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::EqualTest<unsigned_short,long_long>(void)

{
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_26;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_24;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_22;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1e;
  int local_1c [5];
  
  local_1c[4] = 3;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_1e,local_1c + 4);
  if (local_1e.m_int == 2) {
    local_1c[3] = 4;
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_20,local_1c + 3);
    if (local_20.m_int == 5) {
      local_1c[2] = 6;
      SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_22,local_1c + 2);
      if (local_22.m_int == 7) {
        local_1c[1] = 1;
        SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                  (&local_24,local_1c + 1);
        if (local_24.m_int != 0) {
          local_1c[0] = 0;
          SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::
          SafeInt<int>(&local_26,local_1c);
          return local_26.m_int == 0;
        }
      }
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool EqualTest()
	{
		return
			(U)2 == SafeInt<T>(3) &&
			SafeInt<T>(4) == (U)5 &&
			SafeInt<T>(6) == SafeInt<U>(7) &&
			true == SafeInt<T>(1) &&
			false == SafeInt<T>(0);
	}